

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int fits_get_section_range(char **ptr,long *secmin,long *secmax,long *incre,int *status)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  int isanumber;
  char *tstbuff;
  long *local_80;
  char token [71];
  
  tstbuff = (char *)0x0;
  if (0 < *status) {
    return *status;
  }
  iVar1 = fits_get_token2(ptr," ,:",&tstbuff,&isanumber,status);
  pcVar5 = tstbuff;
  if (iVar1 == 0) {
    token[0] = '*';
    token[1] = '\0';
    local_80 = incre;
LAB_0011a333:
    *secmin = 1;
    lVar4 = 0;
LAB_0011a33c:
    lVar3 = 1;
    *secmax = lVar4;
    pcVar5 = *ptr;
    if (*pcVar5 == ':') {
      *ptr = pcVar5 + 1;
      iVar1 = fits_get_token2(ptr," ,",&tstbuff,&isanumber,status);
      pcVar5 = tstbuff;
      if ((iVar1 == 0) || (isanumber == 0)) goto LAB_0011a2e9;
      sVar2 = strlen(tstbuff);
      if (0x46 < sVar2) goto LAB_0011a2da;
      strcpy(token,pcVar5);
      free(pcVar5);
      tstbuff = (char *)0x0;
      lVar3 = atol(token);
      pcVar5 = *ptr;
    }
    *local_80 = lVar3;
    if (*pcVar5 == ',') goto LAB_0011a4c0;
    while (*pcVar5 == ' ') {
LAB_0011a4c0:
      pcVar5 = pcVar5 + 1;
      *ptr = pcVar5;
    }
    if ((-1 < *secmin) && (0 < lVar3 && -1 < *secmax)) {
      return *status;
    }
  }
  else {
    sVar2 = strlen(tstbuff);
    if (sVar2 < 0x47) {
      local_80 = incre;
      strcpy(token,pcVar5);
      free(pcVar5);
      tstbuff = (char *)0x0;
      lVar4 = 1;
      if (token[0] == '*') goto LAB_0011a333;
      if ((token[0] == '-') && (token[1] == '*')) {
        *secmin = 0;
        goto LAB_0011a33c;
      }
      if ((isanumber == 0) || (pcVar5 = *ptr, *pcVar5 != ':')) goto LAB_0011a4a8;
      lVar4 = atol(token);
      *secmin = lVar4;
      *ptr = pcVar5 + 1;
      iVar1 = fits_get_token2(ptr," ,:",&tstbuff,&isanumber,status);
      pcVar5 = tstbuff;
      if ((iVar1 != 0) && (isanumber != 0)) {
        sVar2 = strlen(tstbuff);
        if (sVar2 < 0x47) {
          strcpy(token,pcVar5);
          free(pcVar5);
          tstbuff = (char *)0x0;
          lVar4 = atol(token);
          goto LAB_0011a33c;
        }
        ffpmsg("Error: image section string too long (fits_get_section_range)");
      }
    }
    else {
LAB_0011a2da:
      ffpmsg("Error: image section string too long (fits_get_section_range)");
    }
LAB_0011a2e9:
    free(pcVar5);
  }
LAB_0011a4a8:
  *status = 0x7d;
  return 0x7d;
}

Assistant:

int fits_get_section_range(char **ptr, 
                   long *secmin,
                   long *secmax, 
                   long *incre,
                   int *status)
/*
   Parse the input image section specification string, returning 
   the  min, max and increment values.
   Typical string =   "1:512:2"  or "1:512"
*/
{
    int slen, isanumber;
    char token[FLEN_VALUE], *tstbuff=0;

    if (*status > 0)
        return(*status);

    slen = fits_get_token2(ptr, " ,:", &tstbuff, &isanumber, status); /* get 1st token */
    if (slen==0)
    {
       /* support [:2,:2] type syntax, where the leading * is implied */
       strcpy(token,"*");
    }
    else
    {
       if (strlen(tstbuff) > FLEN_VALUE-1)
       {
          ffpmsg("Error: image section string too long (fits_get_section_range)");
          free(tstbuff);
          *status = URL_PARSE_ERROR;
          return(*status);
       }
       strcpy(token, tstbuff);
       free(tstbuff);
       tstbuff=0;
    }

    if (*token == '*')  /* wild card means to use the whole range */
    {
       *secmin = 1;
       *secmax = 0;
    }
    else if (*token == '-' && *(token+1) == '*' )  /* invert the whole range */
    {
       *secmin = 0;
       *secmax = 1;
    }
    else
    {
      if (slen == 0 || !isanumber || **ptr != ':')
        return(*status = URL_PARSE_ERROR);   

      /* the token contains the min value */
      *secmin = atol(token);

      (*ptr)++;  /* skip the colon between the min and max values */
      slen = fits_get_token2(ptr, " ,:", &tstbuff, &isanumber, status); /* get token */
      if (slen == 0 || !isanumber)
      {
        if (tstbuff)
           free(tstbuff);
        return(*status = URL_PARSE_ERROR);  
      } 
      if (strlen(tstbuff) > FLEN_VALUE-1)
      {
         ffpmsg("Error: image section string too long (fits_get_section_range)");
         free(tstbuff);
         *status = URL_PARSE_ERROR;
         return(*status);
      }
      strcpy(token, tstbuff);
      free(tstbuff);
      tstbuff=0;

      /* the token contains the max value */
      *secmax = atol(token);
    }

    if (**ptr == ':')
    {
        (*ptr)++;  /* skip the colon between the max and incre values */
        slen = fits_get_token2(ptr, " ,", &tstbuff, &isanumber, status); /* get token */
        if (slen == 0 || !isanumber)
        {
            if (tstbuff)
               free(tstbuff);
            return(*status = URL_PARSE_ERROR); 
        }  
        if (strlen(tstbuff) > FLEN_VALUE-1)
        {
           ffpmsg("Error: image section string too long (fits_get_section_range)");
           free(tstbuff);
           *status = URL_PARSE_ERROR;
           return(*status);
        }
        strcpy(token, tstbuff);
        free(tstbuff);
        tstbuff=0;


        *incre = atol(token);
    }
    else
        *incre = 1;  /* default increment if none is supplied */

    if (**ptr == ',')
        (*ptr)++;

    while (**ptr == ' ')   /* skip any trailing blanks */
         (*ptr)++;

    if (*secmin < 0 || *secmax < 0 || *incre < 1)
        *status = URL_PARSE_ERROR;

    return(*status);
}